

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpOps.cpp
# Opt level: O0

sz_ssize_t sznet::net::sockets::sz_udp_recv(sz_sock sock,void *buf,int size,sockaddr *addr)

{
  ssize_t sVar1;
  socklen_t local_3c;
  unsigned_long uStack_38;
  socklen_t lenAddr;
  size_t recvBufSize;
  void *recvBuf;
  sockaddr *addr_local;
  void *pvStack_18;
  int size_local;
  void *buf_local;
  sz_sock sock_local;
  
  recvBufSize = (size_t)buf;
  recvBuf = addr;
  addr_local._4_4_ = size;
  pvStack_18 = buf;
  buf_local._4_4_ = sock;
  uStack_38 = implicit_cast<unsigned_long,int>((int *)((long)&addr_local + 4));
  local_3c = 0x10;
  sVar1 = recvfrom(buf_local._4_4_,(void *)recvBufSize,uStack_38,0,(sockaddr *)recvBuf,&local_3c);
  return sVar1;
}

Assistant:

sz_ssize_t sz_udp_recv(sz_sock sock, void* buf, int size, struct sockaddr* addr)
{
#if defined(SZ_OS_LINUX)
	void* recvBuf = buf;
	size_t recvBufSize = implicit_cast<size_t>(size);
	socklen_t lenAddr = sizeof(*addr);
#else
	char* recvBuf = reinterpret_cast<char*>(buf);
	int recvBufSize = size;
	int lenAddr = sizeof(*addr);
#endif

	return ::recvfrom(sock, recvBuf, recvBufSize, 0, addr, &lenAddr);
}